

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddNeg.c
# Opt level: O0

DdNode * cuddAddRoundOffRecur(DdManager *dd,DdNode *f,double trunc)

{
  DdNode *f_00;
  DdManager *T_00;
  DdManager *E_00;
  double dVar1;
  DdManager *local_68;
  DD_CTFP1 cacheOp;
  double n;
  DdNode *E;
  DdNode *T;
  DdNode *fvn;
  DdNode *fv;
  DdNode *res;
  double trunc_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f->index == 0x7fffffff) {
    dVar1 = ceil((f->type).value * trunc);
    dd_local = (DdManager *)cuddUniqueConst(dd,dVar1 / trunc);
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup1(dd,Cudd_addRoundOff,f);
    if (dd_local == (DdManager *)0x0) {
      f_00 = (f->type).kids.E;
      T_00 = (DdManager *)cuddAddRoundOffRecur(dd,(f->type).kids.T,trunc);
      if (T_00 == (DdManager *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + 1;
        E_00 = (DdManager *)cuddAddRoundOffRecur(dd,f_00,trunc);
        if (E_00 == (DdManager *)0x0) {
          Cudd_RecursiveDeref(dd,(DdNode *)T_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + 1;
          local_68 = T_00;
          if (T_00 != E_00) {
            local_68 = (DdManager *)cuddUniqueInter(dd,f->index,(DdNode *)T_00,(DdNode *)E_00);
          }
          if (local_68 == (DdManager *)0x0) {
            Cudd_RecursiveDeref(dd,(DdNode *)T_00);
            Cudd_RecursiveDeref(dd,(DdNode *)E_00);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + -1;
            *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + -1;
            cuddCacheInsert1(dd,Cudd_addRoundOff,f,&local_68->sentinel);
            dd_local = local_68;
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddAddRoundOffRecur(
  DdManager * dd,
  DdNode * f,
  double  trunc)
{

    DdNode *res, *fv, *fvn, *T, *E;
    double n;
    DD_CTFP1 cacheOp;

    statLine(dd);
    if (cuddIsConstant(f)) {
        n = ceil(cuddV(f)*trunc)/trunc;
        res = cuddUniqueConst(dd,n);
        return(res);
    }
    cacheOp = (DD_CTFP1) Cudd_addRoundOff;
    res = cuddCacheLookup1(dd,cacheOp,f);
    if (res != NULL) {
        return(res);
    }
    /* Recursive Step */
    fv = cuddT(f);
    fvn = cuddE(f);
    T = cuddAddRoundOffRecur(dd,fv,trunc);
    if (T == NULL) {
       return(NULL);
    }
    cuddRef(T);
    E = cuddAddRoundOffRecur(dd,fvn,trunc);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);
    res = (T == E) ? T : cuddUniqueInter(dd,(int)f->index,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd,T);
        Cudd_RecursiveDeref(dd,E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert1(dd,cacheOp,f,res);
    return(res);

}